

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ScissorBoxTestCase::test(ScissorBoxTestCase *this)

{
  StateVerifier *pSVar1;
  TestContext *pTVar2;
  uint uVar3;
  int iVar4;
  uint y;
  uint width_00;
  RenderTarget *pRVar5;
  GLsizei height;
  GLsizei width;
  GLint bottom;
  GLint left;
  int i;
  int numIterations;
  undefined1 local_20 [8];
  Random rnd;
  ScissorBoxTestCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,0xabcdef);
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar3 = tcu::RenderTarget::getWidth(pRVar5);
  pRVar5 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  iVar4 = tcu::RenderTarget::getHeight(pRVar5);
  (*pSVar1->_vptr_StateVerifier[3])(pSVar1,pTVar2,0xc10,0,0,(ulong)uVar3,iVar4);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (bottom = 0; bottom < 0x78; bottom = bottom + 1) {
    uVar3 = de::Random::getInt((Random *)local_20,-64000,64000);
    y = de::Random::getInt((Random *)local_20,-64000,64000);
    width_00 = de::Random::getInt((Random *)local_20,0,64000);
    iVar4 = de::Random::getInt((Random *)local_20,0,64000);
    glu::CallLogWrapper::glScissor
              (&(this->super_ApiCase).super_CallLogWrapper,uVar3,y,width_00,iVar4);
    (*this->m_verifier->_vptr_StateVerifier[3])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xc10,
               (ulong)uVar3,(ulong)y,(ulong)width_00,iVar4);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		// verify initial value
		m_verifier->verifyInteger4(m_testCtx, GL_SCISSOR_BOX, 0, 0, m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			GLint left		= rnd.getInt(-64000, 64000);
			GLint bottom	= rnd.getInt(-64000, 64000);
			GLsizei width	= rnd.getInt(0, 64000);
			GLsizei height	= rnd.getInt(0, 64000);

			glScissor(left, bottom, width, height);
			m_verifier->verifyInteger4(m_testCtx, GL_SCISSOR_BOX, left, bottom, width, height);
			expectError(GL_NO_ERROR);
		}
	}